

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

void __thiscall lest::ptags::~ptags(ptags *this)

{
  undefined1 local_30 [16];
  ostream *local_20;
  char *local_18;
  
  local_20 = (this->super_action).os;
  local_18 = "\n";
  std::
  copy<std::_Rb_tree_const_iterator<std::__cxx11::string>,std::ostream_iterator<std::__cxx11::string,char,std::char_traits<char>>>
            ((_Base_ptr)local_30,(this->result)._M_t._M_impl.super__Rb_tree_header._M_header._M_left
             ,(ostream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>_>
               *)&(this->result)._M_t._M_impl.super__Rb_tree_header);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&(this->result)._M_t);
  return;
}

Assistant:

~ptags()
    {
        std::copy( result.begin(), result.end(), std::ostream_iterator<text>( os, "\n" ) );
    }